

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall cmCacheManager::CacheEntry::SetProperty(CacheEntry *this,string *p,bool v)

{
  undefined7 in_register_00000011;
  allocator<char> local_39;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000011,v) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"OFF",&local_39);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ON",&local_39);
  }
  SetProperty(this,p,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetProperty(const std::string& p, bool v)
{
  this->SetProperty(p, v ? std::string{ "ON" } : std::string{ "OFF" });
}